

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O1

PUThread *
p_uthread_create_full
          (PUThreadFunc func,ppointer data,pboolean joinable,PUThreadPriority prio,psize stack_size,
          pchar *name)

{
  PUThread *pPVar1;
  pchar *ppVar2;
  
  if (func == (PUThreadFunc)0x0) {
    pPVar1 = (PUThread *)0x0;
  }
  else {
    p_spinlock_lock(pp_uthread_new_spin);
    pPVar1 = p_uthread_create_internal(pp_uthread_proxy,joinable,prio,stack_size);
    if (pPVar1 != (PUThread *)0x0) {
      (pPVar1->base).ref_count = 2;
      (pPVar1->base).ours = 1;
      (pPVar1->base).joinable = joinable;
      (pPVar1->base).func = func;
      (pPVar1->base).data = data;
      ppVar2 = p_strdup(name);
      (pPVar1->base).name = ppVar2;
    }
    p_spinlock_unlock(pp_uthread_new_spin);
  }
  return pPVar1;
}

Assistant:

P_LIB_API PUThread *
p_uthread_create_full (PUThreadFunc	func,
		       ppointer		data,
		       pboolean		joinable,
		       PUThreadPriority	prio,
		       psize		stack_size,
		       const pchar	*name)
{
	PUThreadBase *base_thread;

	if (P_UNLIKELY (func == NULL))
		return NULL;

	p_spinlock_lock (pp_uthread_new_spin);

	base_thread = (PUThreadBase *) p_uthread_create_internal (pp_uthread_proxy,
								  joinable,
								  prio,
								  stack_size);

	if (P_LIKELY (base_thread != NULL)) {
		base_thread->ref_count = 2;
		base_thread->ours      = TRUE;
		base_thread->joinable  = joinable;
		base_thread->func      = func;
		base_thread->data      = data;
		base_thread->name      = p_strdup (name);
	}

	p_spinlock_unlock (pp_uthread_new_spin);

	return (PUThread *) base_thread;
}